

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O2

int __thiscall ktx::CommandValidate::OptionsValidate::init(OptionsValidate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *this_00;
  allocator<char> local_17f;
  allocator<char> local_17e;
  allocator<char> local_17d;
  allocator<char> local_17c;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  shared_ptr<const_cxxopts::Value> local_168;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  shared_ptr<const_cxxopts::Value> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [40];
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_179);
  cxxopts::Options::add_options((OptionAdder *)local_70,(Options *)ctx,&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"e,warnings-as-errors",&local_17a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Treat warnings as errors.",&local_17b);
  cxxopts::value<bool>();
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_158;
  local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_150._M_pi;
  local_158 = (element_type *)0x0;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_17c);
  this_00 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_70,&local_90,&local_b0,&local_148,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"g,gltf-basisu",&local_17d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Check compatibility with KHR_texture_basisu glTF extension.",
             &local_17e);
  cxxopts::value<bool>();
  local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_178;
  local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_170._M_pi;
  local_178 = (element_type *)0x0;
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_17f);
  cxxopts::OptionAdder::operator()(this_00,&local_f0,&local_110,&local_168,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_150);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
            opts.add_options()
                ("e,warnings-as-errors", "Treat warnings as errors.")
                ("g,gltf-basisu", "Check compatibility with KHR_texture_basisu glTF extension.");
        }